

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O0

int raft_server_test::add_node_error_cases_test(void)

{
  initializer_list<RaftPkg_*> __l;
  bool bVar1;
  _Setfill<char> _Var2;
  cmd_result_code cVar3;
  _Setw _Var4;
  ostream *poVar5;
  size_t sVar6;
  void *pvVar7;
  element_type *peVar8;
  reference ppRVar9;
  element_type *peVar10;
  element_type *peVar11;
  size_type sVar12;
  element_type *peVar13;
  int __how;
  int __how_00;
  int __how_01;
  int iVar14;
  int _v_10;
  int _ev_5;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  configs_out_1;
  int _v_9;
  int _v_8;
  ptr<log_entry> log_2;
  ptr<buffer> buf_2;
  ptr<srv_config> srv_2;
  ptr<req_msg> req_2;
  rpc_handler nl_handler;
  cmd_result_code _v_7;
  cmd_result_code _ev_4;
  ptr<raft_result> ret_2;
  cmd_result_code _v_6;
  cmd_result_code _ev_3;
  ptr<raft_result> ret_1;
  size_t _v_5;
  size_t _ev_2;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  configs_out;
  int _v_4;
  int _v_3;
  cmd_result_code _v_2;
  cmd_result_code _ev_1;
  size_t expected_cluster_size;
  cmd_result_code _v_1;
  cmd_result_code _ev;
  ptr<raft_result> ret;
  ptr<log_entry> log_1;
  ptr<buffer> buf_1;
  ptr<srv_config> srv_1;
  RaftPkg *ff_1;
  ptr<req_msg> req_1;
  ptr<log_entry> log;
  ptr<buffer> buf;
  ptr<srv_config> srv;
  RaftPkg *ff;
  size_t ii;
  ptr<req_msg> req;
  rpc_handler bad_req_handler;
  atomic<bool> invoked;
  ptr<FakeNetwork> c_net;
  int _gt;
  int _sm;
  size_t num_srvs;
  int _v;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  RaftPkg s3;
  RaftPkg s2;
  RaftPkg s1;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  ptr<FakeNetworkBase> f_base;
  id *in_stack_ffffffffffffe058;
  TestMgr *pTVar15;
  RaftPkg *in_stack_ffffffffffffe060;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
  *in_stack_ffffffffffffe068;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_ffffffffffffe070;
  int *in_stack_ffffffffffffe078;
  msg_type *in_stack_ffffffffffffe080;
  srv_config *in_stack_ffffffffffffe088;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_ffffffffffffe090;
  iterator in_stack_ffffffffffffe098;
  string *in_stack_ffffffffffffe0a0;
  FakeNetwork *in_stack_ffffffffffffe0a8;
  raft_server *in_stack_ffffffffffffe0b0;
  size_t in_stack_ffffffffffffe0c0;
  string *in_stack_ffffffffffffe0c8;
  undefined8 in_stack_ffffffffffffe0d0;
  ptr<FakeNetworkBase> *in_stack_ffffffffffffe0d8;
  RaftPkg *in_stack_ffffffffffffe0e0;
  string *in_stack_ffffffffffffe110;
  FakeNetwork *in_stack_ffffffffffffe118;
  FakeTimer *in_stack_ffffffffffffe120;
  srv_config *in_stack_ffffffffffffe130;
  undefined4 in_stack_ffffffffffffe138;
  undefined4 in_stack_ffffffffffffe13c;
  undefined8 in_stack_ffffffffffffe228;
  undefined1 restart;
  raft_params *in_stack_ffffffffffffe230;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_ffffffffffffe238;
  string local_ca0 [32];
  int local_c80;
  int local_c7c;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  local_c78;
  native_handle_type local_c60;
  char local_c55;
  int local_c54;
  string local_c50 [36];
  int local_c2c;
  string local_c28 [32];
  string local_c08 [32];
  native_handle_type local_be8;
  char local_bdd;
  int local_bdc;
  string local_bd8 [36];
  int local_bb4;
  string local_bb0 [32];
  string local_b90 [64];
  native_handle_type local_b50;
  char local_b45;
  int local_b44;
  string local_b40 [32];
  string local_b20 [51];
  undefined1 local_aed;
  undefined4 local_aec;
  undefined1 local_ab8 [8];
  undefined1 local_ab0 [40];
  undefined1 local_a88 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a78;
  undefined1 local_a70 [32];
  element_type *local_a50;
  char local_a45;
  int local_a44;
  string local_a40 [32];
  cmd_result_code local_a20;
  cmd_result_code local_a1c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9f8;
  char local_9ed;
  int local_9ec;
  string local_9e8 [32];
  cmd_result_code local_9c8;
  cmd_result_code local_9c4;
  native_handle_type local_9a0;
  undefined1 local_995;
  int local_994;
  string local_990 [32];
  size_type local_970;
  size_type local_968;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  local_960;
  native_handle_type local_948;
  char local_93d;
  int local_93c;
  string local_938 [36];
  int local_914;
  string local_910 [32];
  string local_8f0 [32];
  native_handle_type local_8d0;
  char local_8c5;
  int local_8c4;
  string local_8c0 [36];
  int local_89c;
  string local_898 [32];
  string local_878 [32];
  native_handle_type local_858;
  char local_84d;
  int local_84c;
  string local_848 [32];
  cmd_result_code local_828;
  cmd_result_code local_824;
  size_type local_820;
  string local_7f8 [32];
  native_handle_type local_7d8;
  char local_7cd;
  int local_7cc;
  string local_7c8 [32];
  cmd_result_code local_7a8;
  cmd_result_code local_7a4;
  native_handle_type local_760;
  char local_755;
  int local_754;
  string local_750 [32];
  string local_730 [51];
  undefined1 local_6fd;
  undefined4 local_6fc;
  value_type local_6c8;
  undefined1 local_6c0 [8];
  undefined1 local_6b8 [40];
  undefined1 local_690 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_680;
  char local_675;
  int local_674;
  string local_670 [32];
  string local_650 [51];
  undefined1 local_61d;
  undefined4 local_61c;
  value_type local_5e8;
  size_type local_5e0;
  undefined1 local_5d8 [8];
  undefined1 local_5d0 [40];
  undefined1 local_5a8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_598;
  undefined1 local_590 [39];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_569;
  undefined1 local_558 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  char local_52d;
  int local_52c;
  string local_528 [32];
  int local_508;
  int local_504;
  size_type local_500;
  uint local_4f4;
  native_handle_type local_4f0;
  char local_4e5;
  int local_4e4;
  string local_4e0 [32];
  int local_4c0;
  undefined1 local_4b8 [64];
  context local_478;
  undefined1 local_330 [328];
  undefined1 local_1e8 [335];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [52];
  int local_4;
  
  restart = (undefined1)((ulong)in_stack_ffffffffffffe228 >> 0x38);
  iVar14 = (int)((ulong)in_stack_ffffffffffffe0d0 >> 0x20);
  raft_functional_common::reset_log_files();
  nuraft::cs_new<nuraft::FakeNetworkBase>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"S1",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"S2",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"S3",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  RaftPkg::RaftPkg(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,iVar14,
                   in_stack_ffffffffffffe0c8);
  RaftPkg::RaftPkg(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,iVar14,
                   in_stack_ffffffffffffe0c8);
  RaftPkg::RaftPkg(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,iVar14,
                   in_stack_ffffffffffffe0c8);
  local_4b8._0_8_ = local_1e8;
  local_4b8._8_8_ = local_330;
  local_4b8._16_8_ = &local_478;
  local_4b8._24_8_ = local_4b8;
  local_4b8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  std::allocator<RaftPkg_*>::allocator((allocator<RaftPkg_*> *)0x115ac6);
  __l._M_len = (size_type)in_stack_ffffffffffffe0a0;
  __l._M_array = in_stack_ffffffffffffe098;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector
            (in_stack_ffffffffffffe090,__l,(allocator_type *)in_stack_ffffffffffffe088);
  std::allocator<RaftPkg_*>::~allocator((allocator<RaftPkg_*> *)0x115afa);
  local_4c0 = launch_servers(in_stack_ffffffffffffe238,in_stack_ffffffffffffe230,(bool)restart);
  if (local_4c0 != 0) {
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,local_4e0);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
    local_4e4 = (int)std::setw(4);
    poVar5 = std::operator<<(poVar5,(_Setw)local_4e4);
    local_4e5 = (char)std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,local_4e5);
    local_4f0 = (native_handle_type)std::this_thread::get_id();
    sVar6 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_ffffffffffffe060,in_stack_ffffffffffffe058)
    ;
    pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11a);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"0");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_4c0);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string(local_4e0);
    TestSuite::failHandler();
    local_4 = -1;
    local_4f4 = 1;
    goto LAB_0011bead;
  }
  local_500 = std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::size
                        ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_4b8 + 0x28));
  local_504 = 0;
  local_508 = (int)local_500;
  if (local_508 < 1) {
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,local_528);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
    local_52c = (int)std::setw(4);
    poVar5 = std::operator<<(poVar5,(_Setw)local_52c);
    local_52d = (char)std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,local_52d);
    local_538._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::this_thread::get_id();
    sVar6 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_ffffffffffffe060,in_stack_ffffffffffffe058)
    ;
    pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11d);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    expected: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;34mnum_srvs > 0\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    value of ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;32mnum_srvs\x1b[0m: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;31m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_508);
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    value of ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;32m0\x1b[0m: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;31m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_504);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string(local_528);
    TestSuite::failHandler();
    local_4 = -1;
    local_4f4 = 1;
    goto LAB_0011bead;
  }
  nuraft::cs_new<nuraft::FakeNetwork,char_const(&)[7],std::shared_ptr<nuraft::FakeNetworkBase>&>
            ((char (*) [7])in_stack_ffffffffffffe068,
             (shared_ptr<nuraft::FakeNetworkBase> *)in_stack_ffffffffffffe060);
  std::__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1166df);
  nuraft::FakeNetworkBase::addNetwork
            ((FakeNetworkBase *)in_stack_ffffffffffffe0b0,
             (ptr<FakeNetwork> *)in_stack_ffffffffffffe0a8);
  peVar8 = std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1166fe);
  (*(peVar8->super_rpc_client_factory)._vptr_rpc_client_factory[2])(local_558,peVar8,local_38);
  std::shared_ptr<nuraft::rpc_client>::~shared_ptr((shared_ptr<nuraft::rpc_client> *)0x116729);
  peVar8 = std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x116736);
  (*(peVar8->super_rpc_client_factory)._vptr_rpc_client_factory[2])
            ((undefined1 *)((long)&local_569._vptr__Sp_counted_base + 1),peVar8,local_70);
  std::shared_ptr<nuraft::rpc_client>::~shared_ptr((shared_ptr<nuraft::rpc_client> *)0x116761);
  local_569._vptr__Sp_counted_base._0_1_ = 0;
  local_598._M_pi = &local_569;
  std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
  function<raft_server_test::add_node_error_cases_test()::__0,void>
            (in_stack_ffffffffffffe070,(anon_class_8_1_f8307dcc *)in_stack_ffffffffffffe068);
  local_5d0._32_8_ = (element_type *)0x0;
  local_5d0._28_4_ = 6;
  local_5d0._24_4_ = 0;
  local_5d0._20_4_ = 0;
  local_5d0._8_8_ = 0;
  local_5d0._0_8_ = (_func_int **)0x0;
  local_5d8 = (undefined1  [8])0x0;
  in_stack_ffffffffffffe060 = (RaftPkg *)local_5d8;
  pTVar15 = (TestMgr *)local_5d0;
  nuraft::
  cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
            ((unsigned_long *)in_stack_ffffffffffffe088,in_stack_ffffffffffffe080,
             in_stack_ffffffffffffe078,(int *)in_stack_ffffffffffffe070,
             (unsigned_long *)in_stack_ffffffffffffe068,(unsigned_long *)in_stack_ffffffffffffe0a0,
             (unsigned_long *)in_stack_ffffffffffffe0a8);
  for (local_5e0 = 1; local_5e0 < local_500; local_5e0 = local_5e0 + 1) {
    ppRVar9 = std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::operator[]
                        ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_4b8 + 0x28),
                         local_5e0);
    local_5e8 = *ppRVar9;
    RaftPkg::getTestMgr((RaftPkg *)0x11687f);
    raft_functional_common::TestMgr::get_srv_config(pTVar15);
    std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1168ad);
    nuraft::srv_config::serialize(in_stack_ffffffffffffe088);
    local_61c = 0;
    local_61d = 3;
    nuraft::cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
              ((int *)in_stack_ffffffffffffe068,
               (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe060,(log_val_type *)pTVar15);
    peVar10 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x116906);
    nuraft::req_msg::log_entries(peVar10);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)in_stack_ffffffffffffe070,(value_type *)in_stack_ffffffffffffe068);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x11693c);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x116949);
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x116956);
  }
  std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x116a33);
  nuraft::FakeNetwork::findClient(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
  peVar11 = std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x116a5a);
  (*(peVar11->super_rpc_client)._vptr_rpc_client[2])(peVar11,local_5a8,local_590,0);
  std::shared_ptr<nuraft::FakeClient>::~shared_ptr((shared_ptr<nuraft::FakeClient> *)0x116a87);
  std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x116a94);
  std::__cxx11::string::string(local_650);
  nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
  std::__cxx11::string::~string(local_650);
  std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x116ae2);
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)in_stack_ffffffffffffe068,
                     (memory_order)((ulong)in_stack_ffffffffffffe060 >> 0x20));
  if (bVar1) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_ffffffffffffe060,SUB81((ulong)pTVar15 >> 0x38,0));
    local_6b8._32_8_ = (element_type *)0x0;
    local_6b8._28_4_ = 6;
    local_6b8._24_4_ = 0;
    local_6b8._20_4_ = 0;
    local_6b8._8_8_ = 0;
    local_6b8._0_8_ = (_func_int **)0x0;
    local_6c0 = (undefined1  [8])0x0;
    in_stack_ffffffffffffe060 = (RaftPkg *)local_6c0;
    pTVar15 = (TestMgr *)local_6b8;
    nuraft::
    cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
              ((unsigned_long *)in_stack_ffffffffffffe088,in_stack_ffffffffffffe080,
               in_stack_ffffffffffffe078,(int *)in_stack_ffffffffffffe070,
               (unsigned_long *)in_stack_ffffffffffffe068,(unsigned_long *)in_stack_ffffffffffffe0a0
               ,(unsigned_long *)in_stack_ffffffffffffe0a8);
    ppRVar9 = std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::operator[]
                        ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_4b8 + 0x28),1);
    local_6c8 = *ppRVar9;
    RaftPkg::getTestMgr((RaftPkg *)0x117104);
    raft_functional_common::TestMgr::get_srv_config(pTVar15);
    std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x117132);
    nuraft::srv_config::serialize(in_stack_ffffffffffffe088);
    local_6fc = 0;
    local_6fd = 2;
    nuraft::cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
              ((int *)in_stack_ffffffffffffe068,
               (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe060,(log_val_type *)pTVar15);
    peVar10 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11718b);
    nuraft::req_msg::log_entries(peVar10);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)in_stack_ffffffffffffe070,(value_type *)in_stack_ffffffffffffe068);
    std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1171c1);
    nuraft::FakeNetwork::findClient(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
    peVar11 = std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1171e8);
    (*(peVar11->super_rpc_client)._vptr_rpc_client[2])(peVar11,local_690,local_590,0);
    std::shared_ptr<nuraft::FakeClient>::~shared_ptr((shared_ptr<nuraft::FakeClient> *)0x117215);
    std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x117222);
    std::__cxx11::string::string(local_730);
    nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
    std::__cxx11::string::~string(local_730);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x117270);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x11727d);
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x11728a);
    std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x117297);
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_ffffffffffffe068,
                       (memory_order)((ulong)in_stack_ffffffffffffe060 >> 0x20));
    if (bVar1) {
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_ffffffffffffe060,SUB81((ulong)pTVar15 >> 0x38,0));
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x11787f);
      RaftPkg::getTestMgr((RaftPkg *)0x117894);
      raft_functional_common::TestMgr::get_srv_config(pTVar15);
      std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )in_stack_ffffffffffffe060);
      nuraft::raft_server::add_srv
                ((raft_server *)CONCAT44(in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138),
                 in_stack_ffffffffffffe130);
      std::
      shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
      ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)0x1178e9);
      std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1178f6);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x117903);
      RaftPkg::getTestMgr((RaftPkg *)0x117918);
      raft_functional_common::TestMgr::get_srv_config(pTVar15);
      std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )in_stack_ffffffffffffe060);
      nuraft::raft_server::add_srv
                ((raft_server *)CONCAT44(in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138),
                 in_stack_ffffffffffffe130);
      std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x11796d);
      local_7a4 = SERVER_IS_JOINING;
      std::
      __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x117985);
      local_7a8 = nuraft::
                  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
                  get_result_code(in_stack_ffffffffffffe068);
      if (local_7a4 == local_7a8) {
        std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x117f01);
        std::__cxx11::string::string(local_7f8);
        nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
        std::__cxx11::string::~string(local_7f8);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x117f4f);
        RaftPkg::getTestMgr((RaftPkg *)0x117f64);
        raft_functional_common::TestMgr::get_srv_config(pTVar15);
        std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_ffffffffffffe060);
        nuraft::raft_server::add_srv
                  ((raft_server *)CONCAT44(in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138),
                   in_stack_ffffffffffffe130);
        std::
        shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
        ::operator=((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)in_stack_ffffffffffffe060,
                    (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)pTVar15);
        std::
        shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
        ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                       *)0x117fde);
        std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x117feb)
        ;
        local_820 = 2;
        std::
        __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x118004);
        cVar3 = nuraft::
                cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
                get_result_code(in_stack_ffffffffffffe068);
        if (cVar3 == OK) {
          local_820 = 3;
        }
        else {
          local_824 = CONFIG_CHANGING;
          std::
          __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x118096);
          local_828 = nuraft::
                      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                      ::get_result_code(in_stack_ffffffffffffe068);
          if (local_824 != local_828) {
            poVar5 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,"        time: ");
            poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar5 = std::operator<<(poVar5,local_848);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"      thread: ");
            poVar5 = std::operator<<(poVar5,"\x1b[33m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
            local_84c = (int)std::setw(4);
            poVar5 = std::operator<<(poVar5,(_Setw)local_84c);
            local_84d = (char)std::setfill<char>('0');
            poVar5 = std::operator<<(poVar5,local_84d);
            local_858 = (native_handle_type)std::this_thread::get_id();
            sVar6 = std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
            pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
            poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          in: ");
            poVar5 = std::operator<<(poVar5,"\x1b[36m");
            poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
            poVar5 = std::operator<<(poVar5,"()\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          at: ");
            poVar5 = std::operator<<(poVar5,"\x1b[32m");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                    );
            poVar5 = std::operator<<(poVar5,"\x1b[0m:");
            poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x167);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,
                                     "    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n");
            poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_824);
            poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
            poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_828);
            std::operator<<(poVar5,"\x1b[0m\n");
            std::__cxx11::string::~string(local_848);
            TestSuite::failHandler();
            local_4 = -1;
            local_4f4 = 1;
            goto LAB_00119726;
          }
        }
        std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1185af);
        std::__cxx11::string::string(local_878);
        nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
        std::__cxx11::string::~string(local_878);
        std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1185fd);
        std::__cxx11::string::string(local_898);
        nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
        std::__cxx11::string::~string(local_898);
        local_89c = wait_for_sm_exec((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)
                                     in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0);
        if (local_89c == 0) {
          std::__shared_ptr_access<nuraft::FakeTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::FakeTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x118ba8);
          nuraft::FakeTimer::invoke
                    (in_stack_ffffffffffffe120,(int)((ulong)in_stack_ffffffffffffe118 >> 0x20));
          std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x118bc4);
          std::__cxx11::string::string(local_8f0);
          nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
          std::__cxx11::string::~string(local_8f0);
          std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x118c12);
          std::__cxx11::string::string(local_910);
          nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
          std::__cxx11::string::~string(local_910);
          local_914 = wait_for_sm_exec((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)
                                       in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0);
          if (local_914 == 0) {
            std::
            vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            ::vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                      *)0x1191c5);
            std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1191d2);
            nuraft::raft_server::get_srv_config_all
                      (in_stack_ffffffffffffe0b0,
                       (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                        *)in_stack_ffffffffffffe0a8);
            local_968 = local_820;
            local_970 = std::
                        vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                        ::size(&local_960);
            bVar1 = local_968 != local_970;
            if (bVar1) {
              poVar5 = (ostream *)
                       std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              poVar5 = std::operator<<(poVar5,"        time: ");
              poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
              TestSuite::getTimeString_abi_cxx11_();
              poVar5 = std::operator<<(poVar5,local_990);
              poVar5 = std::operator<<(poVar5,"\x1b[0m");
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"      thread: ");
              poVar5 = std::operator<<(poVar5,"\x1b[33m");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
              local_994 = (int)std::setw(4);
              poVar5 = std::operator<<(poVar5,(_Setw)local_994);
              local_995 = std::setfill<char>('0');
              poVar5 = std::operator<<(poVar5,local_995);
              local_9a0 = (native_handle_type)std::this_thread::get_id();
              sVar6 = std::hash<std::thread::id>::operator()
                                ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
              pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
              poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
              poVar5 = std::operator<<(poVar5,"\x1b[0m");
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"          in: ");
              poVar5 = std::operator<<(poVar5,"\x1b[36m");
              poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
              poVar5 = std::operator<<(poVar5,"()\x1b[0m");
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"          at: ");
              poVar5 = std::operator<<(poVar5,"\x1b[32m");
              poVar5 = std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                      );
              poVar5 = std::operator<<(poVar5,"\x1b[0m:");
              poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x178);
              poVar5 = std::operator<<(poVar5,"\x1b[0m");
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n")
              ;
              poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_968);
              poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
              poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_970);
              std::operator<<(poVar5,"\x1b[0m\n");
              std::__cxx11::string::~string(local_990);
              TestSuite::failHandler();
              local_4 = -1;
            }
            local_4f4 = (uint)bVar1;
            std::
            vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)in_stack_ffffffffffffe070);
          }
          else {
            poVar5 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,"        time: ");
            poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar5 = std::operator<<(poVar5,local_938);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"      thread: ");
            poVar5 = std::operator<<(poVar5,"\x1b[33m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
            local_93c = (int)std::setw(4);
            poVar5 = std::operator<<(poVar5,(_Setw)local_93c);
            local_93d = (char)std::setfill<char>('0');
            poVar5 = std::operator<<(poVar5,local_93d);
            local_948 = (native_handle_type)std::this_thread::get_id();
            sVar6 = std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
            pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
            poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          in: ");
            poVar5 = std::operator<<(poVar5,"\x1b[36m");
            poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
            poVar5 = std::operator<<(poVar5,"()\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          at: ");
            poVar5 = std::operator<<(poVar5,"\x1b[32m");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                    );
            poVar5 = std::operator<<(poVar5,"\x1b[0m:");
            poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x173);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,
                                     "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                                    );
            poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
            poVar5 = std::operator<<(poVar5,"0");
            poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
            poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_914);
            std::operator<<(poVar5,"\x1b[0m\n");
            std::__cxx11::string::~string(local_938);
            TestSuite::failHandler();
            local_4 = -1;
            local_4f4 = 1;
          }
        }
        else {
          poVar5 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"        time: ");
          poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar5 = std::operator<<(poVar5,local_8c0);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"      thread: ");
          poVar5 = std::operator<<(poVar5,"\x1b[33m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
          local_8c4 = (int)std::setw(4);
          poVar5 = std::operator<<(poVar5,(_Setw)local_8c4);
          local_8c5 = (char)std::setfill<char>('0');
          poVar5 = std::operator<<(poVar5,local_8c5);
          local_8d0 = (native_handle_type)std::this_thread::get_id();
          sVar6 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
          pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
          poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"          in: ");
          poVar5 = std::operator<<(poVar5,"\x1b[36m");
          poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
          poVar5 = std::operator<<(poVar5,"()\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"          at: ");
          poVar5 = std::operator<<(poVar5,"\x1b[32m");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                  );
          poVar5 = std::operator<<(poVar5,"\x1b[0m:");
          poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x16d);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,
                                   "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                                  );
          poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
          poVar5 = std::operator<<(poVar5,"0");
          poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
          poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_89c);
          std::operator<<(poVar5,"\x1b[0m\n");
          std::__cxx11::string::~string(local_8c0);
          TestSuite::failHandler();
          local_4 = -1;
          local_4f4 = 1;
        }
      }
      else {
        poVar5 = (ostream *)
                 std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"        time: ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_7c8);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"      thread: ");
        poVar5 = std::operator<<(poVar5,"\x1b[33m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
        local_7cc = (int)std::setw(4);
        poVar5 = std::operator<<(poVar5,(_Setw)local_7cc);
        local_7cd = (char)std::setfill<char>('0');
        poVar5 = std::operator<<(poVar5,local_7cd);
        local_7d8 = (native_handle_type)std::this_thread::get_id();
        sVar6 = std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
        pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
        poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          in: ");
        poVar5 = std::operator<<(poVar5,"\x1b[36m");
        poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
        poVar5 = std::operator<<(poVar5,"()\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          at: ");
        poVar5 = std::operator<<(poVar5,"\x1b[32m");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                );
        poVar5 = std::operator<<(poVar5,"\x1b[0m:");
        poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x158);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_7a4);
        poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_7a8);
        std::operator<<(poVar5,"\x1b[0m\n");
        std::__cxx11::string::~string(local_7c8);
        TestSuite::failHandler();
        local_4 = -1;
        local_4f4 = 1;
      }
LAB_00119726:
      std::
      shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
      ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)0x119733);
      if (local_4f4 == 0) {
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x119751);
        RaftPkg::getTestMgr((RaftPkg *)0x119766);
        raft_functional_common::TestMgr::get_srv_config(pTVar15);
        std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_ffffffffffffe060);
        nuraft::raft_server::add_srv
                  ((raft_server *)CONCAT44(in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138),
                   in_stack_ffffffffffffe130);
        std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1197bb)
        ;
        local_9c4 = SERVER_ALREADY_EXISTS;
        std::
        __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1197d3);
        local_9c8 = nuraft::
                    cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
                    get_result_code(in_stack_ffffffffffffe068);
        bVar1 = local_9c4 != local_9c8;
        if (bVar1) {
          poVar5 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"        time: ");
          poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar5 = std::operator<<(poVar5,local_9e8);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"      thread: ");
          poVar5 = std::operator<<(poVar5,"\x1b[33m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
          local_9ec = (int)std::setw(4);
          poVar5 = std::operator<<(poVar5,(_Setw)local_9ec);
          local_9ed = (char)std::setfill<char>('0');
          poVar5 = std::operator<<(poVar5,local_9ed);
          local_9f8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::this_thread::get_id();
          sVar6 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
          pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
          poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"          in: ");
          poVar5 = std::operator<<(poVar5,"\x1b[36m");
          poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
          poVar5 = std::operator<<(poVar5,"()\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"          at: ");
          poVar5 = std::operator<<(poVar5,"\x1b[32m");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                  );
          poVar5 = std::operator<<(poVar5,"\x1b[0m:");
          poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x17e);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n")
          ;
          poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_9c4);
          poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
          poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_9c8);
          std::operator<<(poVar5,"\x1b[0m\n");
          std::__cxx11::string::~string(local_9e8);
          TestSuite::failHandler();
          local_4 = -1;
        }
        local_4f4 = (uint)bVar1;
        std::
        shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
        ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                       *)0x119d53);
        if (local_4f4 == 0) {
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x119d71);
          RaftPkg::getTestMgr((RaftPkg *)0x119d86);
          raft_functional_common::TestMgr::get_srv_config(pTVar15);
          std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_ffffffffffffe060);
          nuraft::raft_server::add_srv
                    ((raft_server *)CONCAT44(in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138),
                     in_stack_ffffffffffffe130);
          std::shared_ptr<nuraft::srv_config>::~shared_ptr
                    ((shared_ptr<nuraft::srv_config> *)0x119ddb);
          local_a1c = NOT_LEADER;
          std::
          __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x119df3);
          local_a20 = nuraft::
                      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                      ::get_result_code(in_stack_ffffffffffffe068);
          bVar1 = local_a1c != local_a20;
          if (bVar1) {
            poVar5 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,"        time: ");
            poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar5 = std::operator<<(poVar5,local_a40);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"      thread: ");
            poVar5 = std::operator<<(poVar5,"\x1b[33m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
            local_a44 = (int)std::setw(4);
            poVar5 = std::operator<<(poVar5,(_Setw)local_a44);
            local_a45 = (char)std::setfill<char>('0');
            poVar5 = std::operator<<(poVar5,local_a45);
            local_a50 = (element_type *)std::this_thread::get_id();
            sVar6 = std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
            pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
            poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          in: ");
            poVar5 = std::operator<<(poVar5,"\x1b[36m");
            poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
            poVar5 = std::operator<<(poVar5,"()\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          at: ");
            poVar5 = std::operator<<(poVar5,"\x1b[32m");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                    );
            poVar5 = std::operator<<(poVar5,"\x1b[0m:");
            poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x184);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,
                                     "    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n");
            poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_a1c);
            poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
            poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_a20);
            std::operator<<(poVar5,"\x1b[0m\n");
            std::__cxx11::string::~string(local_a40);
            TestSuite::failHandler();
            local_4 = -1;
          }
          local_4f4 = (uint)bVar1;
          std::
          shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
          ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                         *)0x11a366);
          if (local_4f4 == 0) {
            local_a78._M_pi = &local_569;
            std::
            function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
            ::function<raft_server_test::add_node_error_cases_test()::__1,void>
                      (in_stack_ffffffffffffe070,
                       (anon_class_8_1_f8307dcc *)in_stack_ffffffffffffe068);
            local_ab0._32_8_ = (element_type *)0x0;
            local_ab0._28_4_ = 6;
            local_ab0._24_4_ = 0;
            local_ab0._20_4_ = 0;
            local_ab0._8_8_ = 0;
            local_ab0._0_8_ = (_func_int **)0x0;
            local_ab8 = (undefined1  [8])0x0;
            in_stack_ffffffffffffe060 = (RaftPkg *)local_ab8;
            pTVar15 = (TestMgr *)local_ab0;
            nuraft::
            cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
                      ((unsigned_long *)in_stack_ffffffffffffe088,in_stack_ffffffffffffe080,
                       in_stack_ffffffffffffe078,(int *)in_stack_ffffffffffffe070,
                       (unsigned_long *)in_stack_ffffffffffffe068,
                       (unsigned_long *)in_stack_ffffffffffffe0a0,
                       (unsigned_long *)in_stack_ffffffffffffe0a8);
            RaftPkg::getTestMgr((RaftPkg *)0x11a44b);
            raft_functional_common::TestMgr::get_srv_config(pTVar15);
            std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x11a479);
            nuraft::srv_config::serialize(in_stack_ffffffffffffe088);
            local_aec = 0;
            local_aed = 3;
            nuraft::
            cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
                      ((int *)in_stack_ffffffffffffe068,
                       (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffe060,
                       (log_val_type *)pTVar15);
            peVar10 = std::
                      __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x11a4d2);
            nuraft::req_msg::log_entries(peVar10);
            std::
            vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         *)in_stack_ffffffffffffe070,(value_type *)in_stack_ffffffffffffe068);
            std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11a508);
            nuraft::FakeNetwork::findClient(in_stack_ffffffffffffe0a8,in_stack_ffffffffffffe0a0);
            peVar11 = std::
                      __shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x11a52f);
            (*(peVar11->super_rpc_client)._vptr_rpc_client[2])(peVar11,local_a88,local_a70,0);
            std::shared_ptr<nuraft::FakeClient>::~shared_ptr
                      ((shared_ptr<nuraft::FakeClient> *)0x11a55c);
            std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11a569);
            std::__cxx11::string::string(local_b20);
            nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
            std::__cxx11::string::~string(local_b20);
            std::shared_ptr<nuraft::log_entry>::~shared_ptr
                      ((shared_ptr<nuraft::log_entry> *)0x11a5b7);
            std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x11a5c4);
            std::shared_ptr<nuraft::srv_config>::~shared_ptr
                      ((shared_ptr<nuraft::srv_config> *)0x11a5d1);
            std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x11a5de);
            bVar1 = std::atomic<bool>::load
                              ((atomic<bool> *)in_stack_ffffffffffffe068,
                               (memory_order)((ulong)in_stack_ffffffffffffe060 >> 0x20));
            if (bVar1) {
              std::atomic<bool>::operator=
                        ((atomic<bool> *)in_stack_ffffffffffffe060,SUB81((ulong)pTVar15 >> 0x38,0));
              std::
              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11abf1);
              RaftPkg::getTestMgr((RaftPkg *)0x11ac06);
              raft_functional_common::TestMgr::get_srv_config(pTVar15);
              std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_ffffffffffffe060);
              nuraft::raft_server::add_srv
                        ((raft_server *)
                         CONCAT44(in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138),
                         in_stack_ffffffffffffe130);
              std::
              shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
              ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                             *)0x11ac5b);
              std::shared_ptr<nuraft::srv_config>::~shared_ptr
                        ((shared_ptr<nuraft::srv_config> *)0x11ac68);
              std::
              __shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11ac75);
              std::__cxx11::string::string(local_b90);
              nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
              std::__cxx11::string::~string(local_b90);
              std::
              __shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11acc3);
              std::__cxx11::string::string(local_bb0);
              nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
              std::__cxx11::string::~string(local_bb0);
              local_bb4 = wait_for_sm_exec((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)
                                           in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0);
              if (local_bb4 == 0) {
                std::
                __shared_ptr_access<nuraft::FakeTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::FakeTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x11b294);
                nuraft::FakeTimer::invoke
                          (in_stack_ffffffffffffe120,(int)((ulong)in_stack_ffffffffffffe118 >> 0x20)
                          );
                std::
                __shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x11b2b0);
                std::__cxx11::string::string(local_c08);
                nuraft::FakeNetwork::execReqResp
                          (in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
                std::__cxx11::string::~string(local_c08);
                std::
                __shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x11b2fe);
                std::__cxx11::string::string(local_c28);
                nuraft::FakeNetwork::execReqResp
                          (in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
                std::__cxx11::string::~string(local_c28);
                local_c2c = wait_for_sm_exec((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)
                                             in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0);
                if (local_c2c == 0) {
                  std::
                  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  ::vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                            *)0x11b8b1);
                  std::
                  __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x11b8be);
                  iVar14 = (int)&local_c78;
                  nuraft::raft_server::get_srv_config_all
                            (in_stack_ffffffffffffe0b0,
                             (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                              *)in_stack_ffffffffffffe0a8);
                  local_c7c = 3;
                  sVar12 = std::
                           vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                           ::size(&local_c78);
                  local_c80 = (int)sVar12;
                  bVar1 = local_c7c != local_c80;
                  if (bVar1) {
                    poVar5 = (ostream *)
                             std::ostream::operator<<
                                       (&std::cout,std::endl<char,std::char_traits<char>>);
                    poVar5 = std::operator<<(poVar5,"        time: ");
                    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar5 = std::operator<<(poVar5,local_ca0);
                    poVar5 = std::operator<<(poVar5,"\x1b[0m");
                    poVar5 = std::operator<<(poVar5,"\n");
                    poVar5 = std::operator<<(poVar5,"      thread: ");
                    poVar5 = std::operator<<(poVar5,"\x1b[33m");
                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
                    _Var4 = std::setw(4);
                    poVar5 = std::operator<<(poVar5,_Var4);
                    _Var2 = std::setfill<char>('0');
                    poVar5 = std::operator<<(poVar5,_Var2._M_c);
                    std::this_thread::get_id();
                    sVar6 = std::hash<std::thread::id>::operator()
                                      ((hash<std::thread::id> *)in_stack_ffffffffffffe060,
                                       (id *)pTVar15);
                    pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
                    poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
                    poVar5 = std::operator<<(poVar5,"\x1b[0m");
                    poVar5 = std::operator<<(poVar5,"\n");
                    poVar5 = std::operator<<(poVar5,"          in: ");
                    poVar5 = std::operator<<(poVar5,"\x1b[36m");
                    poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
                    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
                    poVar5 = std::operator<<(poVar5,"\n");
                    poVar5 = std::operator<<(poVar5,"          at: ");
                    poVar5 = std::operator<<(poVar5,"\x1b[32m");
                    poVar5 = std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                            );
                    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
                    in_stack_ffffffffffffe0b0 = (raft_server *)std::operator<<(poVar5,"\x1b[1;35m");
                    poVar5 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffe0b0,0x1ac);
                    poVar5 = std::operator<<(poVar5,"\x1b[0m");
                    poVar5 = std::operator<<(poVar5,"\n");
                    poVar5 = std::operator<<(poVar5,
                                             "    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n");
                    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c7c);
                    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
                    in_stack_ffffffffffffe070 =
                         (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                          *)std::operator<<(poVar5,"      actual: \x1b[1;31m");
                    poVar5 = (ostream *)
                             std::ostream::operator<<(in_stack_ffffffffffffe070,local_c80);
                    iVar14 = 0x26e4c2;
                    std::operator<<(poVar5,"\x1b[0m\n");
                    std::__cxx11::string::~string(local_ca0);
                    TestSuite::failHandler();
                    local_4 = -1;
                  }
                  local_4f4 = (uint)bVar1;
                  std::
                  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                             *)in_stack_ffffffffffffe070);
                  if (local_4f4 == 0) {
                    print_stats((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)
                                in_stack_ffffffffffffe0b0);
                    peVar13 = std::
                              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x11bde1);
                    nuraft::raft_server::shutdown(peVar13,iVar14,__how);
                    peVar13 = std::
                              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x11bdf8);
                    nuraft::raft_server::shutdown(peVar13,iVar14,__how_00);
                    peVar13 = std::
                              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x11be0f);
                    nuraft::raft_server::shutdown(peVar13,iVar14,__how_01);
                    std::
                    __shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x11be26);
                    nuraft::FakeNetworkBase::destroy((FakeNetworkBase *)in_stack_ffffffffffffe060);
                    local_4 = 0;
                    local_4f4 = 1;
                  }
                }
                else {
                  poVar5 = (ostream *)
                           std::ostream::operator<<
                                     (&std::cout,std::endl<char,std::char_traits<char>>);
                  poVar5 = std::operator<<(poVar5,"        time: ");
                  poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar5 = std::operator<<(poVar5,local_c50);
                  poVar5 = std::operator<<(poVar5,"\x1b[0m");
                  poVar5 = std::operator<<(poVar5,"\n");
                  poVar5 = std::operator<<(poVar5,"      thread: ");
                  poVar5 = std::operator<<(poVar5,"\x1b[33m");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
                  local_c54 = (int)std::setw(4);
                  poVar5 = std::operator<<(poVar5,(_Setw)local_c54);
                  local_c55 = (char)std::setfill<char>('0');
                  poVar5 = std::operator<<(poVar5,local_c55);
                  local_c60 = (native_handle_type)std::this_thread::get_id();
                  sVar6 = std::hash<std::thread::id>::operator()
                                    ((hash<std::thread::id> *)in_stack_ffffffffffffe060,
                                     (id *)pTVar15);
                  pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
                  poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
                  poVar5 = std::operator<<(poVar5,"\x1b[0m");
                  poVar5 = std::operator<<(poVar5,"\n");
                  poVar5 = std::operator<<(poVar5,"          in: ");
                  poVar5 = std::operator<<(poVar5,"\x1b[36m");
                  poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
                  poVar5 = std::operator<<(poVar5,"()\x1b[0m");
                  poVar5 = std::operator<<(poVar5,"\n");
                  poVar5 = std::operator<<(poVar5,"          at: ");
                  poVar5 = std::operator<<(poVar5,"\x1b[32m");
                  poVar5 = std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                          );
                  poVar5 = std::operator<<(poVar5,"\x1b[0m:");
                  poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1a6);
                  poVar5 = std::operator<<(poVar5,"\x1b[0m");
                  poVar5 = std::operator<<(poVar5,"\n");
                  poVar5 = std::operator<<(poVar5,
                                           "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                                          );
                  poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
                  poVar5 = std::operator<<(poVar5,"0");
                  poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
                  poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c2c);
                  std::operator<<(poVar5,"\x1b[0m\n");
                  std::__cxx11::string::~string(local_c50);
                  TestSuite::failHandler();
                  local_4 = -1;
                  local_4f4 = 1;
                }
              }
              else {
                poVar5 = (ostream *)
                         std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>)
                ;
                poVar5 = std::operator<<(poVar5,"        time: ");
                poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar5 = std::operator<<(poVar5,local_bd8);
                poVar5 = std::operator<<(poVar5,"\x1b[0m");
                poVar5 = std::operator<<(poVar5,"\n");
                poVar5 = std::operator<<(poVar5,"      thread: ");
                poVar5 = std::operator<<(poVar5,"\x1b[33m");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
                local_bdc = (int)std::setw(4);
                poVar5 = std::operator<<(poVar5,(_Setw)local_bdc);
                local_bdd = (char)std::setfill<char>('0');
                poVar5 = std::operator<<(poVar5,local_bdd);
                local_be8 = (native_handle_type)std::this_thread::get_id();
                sVar6 = std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15)
                ;
                pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
                poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
                poVar5 = std::operator<<(poVar5,"\x1b[0m");
                poVar5 = std::operator<<(poVar5,"\n");
                poVar5 = std::operator<<(poVar5,"          in: ");
                poVar5 = std::operator<<(poVar5,"\x1b[36m");
                poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
                poVar5 = std::operator<<(poVar5,"()\x1b[0m");
                poVar5 = std::operator<<(poVar5,"\n");
                poVar5 = std::operator<<(poVar5,"          at: ");
                poVar5 = std::operator<<(poVar5,"\x1b[32m");
                poVar5 = std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                        );
                poVar5 = std::operator<<(poVar5,"\x1b[0m:");
                poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1a0);
                poVar5 = std::operator<<(poVar5,"\x1b[0m");
                poVar5 = std::operator<<(poVar5,"\n");
                poVar5 = std::operator<<(poVar5,
                                         "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                                        );
                poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
                poVar5 = std::operator<<(poVar5,"0");
                poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
                poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_bb4);
                std::operator<<(poVar5,"\x1b[0m\n");
                std::__cxx11::string::~string(local_bd8);
                TestSuite::failHandler();
                local_4 = -1;
                local_4f4 = 1;
              }
            }
            else {
              poVar5 = (ostream *)
                       std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              poVar5 = std::operator<<(poVar5,"        time: ");
              poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
              TestSuite::getTimeString_abi_cxx11_();
              poVar5 = std::operator<<(poVar5,local_b40);
              poVar5 = std::operator<<(poVar5,"\x1b[0m");
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"      thread: ");
              poVar5 = std::operator<<(poVar5,"\x1b[33m");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
              local_b44 = (int)std::setw(4);
              poVar5 = std::operator<<(poVar5,(_Setw)local_b44);
              local_b45 = (char)std::setfill<char>('0');
              poVar5 = std::operator<<(poVar5,local_b45);
              local_b50 = (native_handle_type)std::this_thread::get_id();
              sVar6 = std::hash<std::thread::id>::operator()
                                ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
              pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
              poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
              poVar5 = std::operator<<(poVar5,"\x1b[0m");
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"          in: ");
              poVar5 = std::operator<<(poVar5,"\x1b[36m");
              poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
              poVar5 = std::operator<<(poVar5,"()\x1b[0m");
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"          at: ");
              poVar5 = std::operator<<(poVar5,"\x1b[32m");
              poVar5 = std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                      );
              poVar5 = std::operator<<(poVar5,"\x1b[0m:");
              poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x199);
              poVar5 = std::operator<<(poVar5,"\x1b[0m");
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n");
              poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
              poVar5 = std::operator<<(poVar5,"true");
              poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
              poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
              poVar5 = std::operator<<(poVar5,"false");
              std::operator<<(poVar5,"\x1b[0m\n");
              std::__cxx11::string::~string(local_b40);
              TestSuite::failHandler();
              local_4 = -1;
              local_4f4 = 1;
            }
            std::
            function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            ::~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                         *)0x11be64);
          }
        }
      }
    }
    else {
      poVar5 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"        time: ");
      poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_750);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"      thread: ");
      poVar5 = std::operator<<(poVar5,"\x1b[33m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
      local_754 = (int)std::setw(4);
      poVar5 = std::operator<<(poVar5,(_Setw)local_754);
      local_755 = (char)std::setfill<char>('0');
      poVar5 = std::operator<<(poVar5,local_755);
      local_760 = (native_handle_type)std::this_thread::get_id();
      sVar6 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          in: ");
      poVar5 = std::operator<<(poVar5,"\x1b[36m");
      poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
      poVar5 = std::operator<<(poVar5,"()\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          at: ");
      poVar5 = std::operator<<(poVar5,"\x1b[32m");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar5 = std::operator<<(poVar5,"\x1b[0m:");
      poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x14b);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
      poVar5 = std::operator<<(poVar5,"true");
      poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
      poVar5 = std::operator<<(poVar5,"false");
      std::operator<<(poVar5,"\x1b[0m\n");
      std::__cxx11::string::~string(local_750);
      TestSuite::failHandler();
      local_4 = -1;
      local_4f4 = 1;
    }
  }
  else {
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,local_670);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
    local_674 = (int)std::setw(4);
    poVar5 = std::operator<<(poVar5,(_Setw)local_674);
    local_675 = (char)std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,local_675);
    local_680._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::this_thread::get_id();
    sVar6 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_ffffffffffffe060,(id *)pTVar15);
    pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"add_node_error_cases_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x13b);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"true");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    poVar5 = std::operator<<(poVar5,"false");
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string(local_670);
    TestSuite::failHandler();
    local_4 = -1;
    local_4f4 = 1;
  }
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  ~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
             *)0x11be82);
  std::shared_ptr<nuraft::FakeNetwork>::~shared_ptr((shared_ptr<nuraft::FakeNetwork> *)0x11be8f);
LAB_0011bead:
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::~vector
            ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)in_stack_ffffffffffffe070);
  RaftPkg::~RaftPkg(in_stack_ffffffffffffe060);
  RaftPkg::~RaftPkg(in_stack_ffffffffffffe060);
  RaftPkg::~RaftPkg(in_stack_ffffffffffffe060);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  std::shared_ptr<nuraft::FakeNetworkBase>::~shared_ptr
            ((shared_ptr<nuraft::FakeNetworkBase> *)0x11bf15);
  return local_4;
}

Assistant:

int add_node_error_cases_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3};

    CHK_Z( launch_servers( pkgs ) );

    size_t num_srvs = pkgs.size();
    CHK_GT(num_srvs, 0);

    ptr<FakeNetwork> c_net = cs_new<FakeNetwork>("client", f_base);
    f_base->addNetwork(c_net);
    c_net->create_client(s1_addr);
    c_net->create_client(s2_addr);

    std::atomic<bool> invoked(false);
    rpc_handler bad_req_handler = [&invoked]( ptr<resp_msg>& resp,
                                              ptr<rpc_exception>& err ) -> int {
        invoked.store(true);
        CHK_EQ( cmd_result_code::BAD_REQUEST, resp->get_result_code() );
        return 0;
    };

    {   // Attempt to add more than one server at once.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        for (size_t ii=1; ii<num_srvs; ++ii) {
            RaftPkg* ff = pkgs[ii];
            ptr<srv_config> srv = ff->getTestMgr()->get_srv_config();
            ptr<buffer> buf(srv->serialize());
            ptr<log_entry> log( cs_new<log_entry>
                                ( 0, buf, log_val_type::cluster_server ) );
            req->log_entries().push_back(log);
        }
        c_net->findClient(s1_addr)->send( req, bad_req_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Attempt to add server with wrong message type.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        RaftPkg* ff = pkgs[1];
        ptr<srv_config> srv = ff->getTestMgr()->get_srv_config();
        ptr<buffer> buf(srv->serialize());
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, buf, log_val_type::conf ) );
        req->log_entries().push_back(log);
        c_net->findClient(s1_addr)->send( req, bad_req_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Attempt to add server while previous one is in progress.

        // Add S2 to S1.
        s1.raftServer->add_srv( *(s2.getTestMgr()->get_srv_config()) );

        // Now adding S2 is in progress, add S3 to S1.
        ptr<raft_result> ret =
            s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );

        // Should fail.
        CHK_EQ( cmd_result_code::SERVER_IS_JOINING, ret->get_result_code() );

        // Join req/resp.
        s1.fNet->execReqResp();

        // Now config change is in progress, add S3 to S1.
        ret = s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );

        // May fail (depends on commit thread wake-up timing).
        size_t expected_cluster_size = 2;
        if (ret->get_result_code() == cmd_result_code::OK) {
            // If succeed, S3 is also a member of group.
            expected_cluster_size = 3;
        } else {
            // If not, error code should be CONFIG_CHANGNING.
            CHK_EQ( cmd_result_code::CONFIG_CHANGING, ret->get_result_code() );
        }

        // Finish adding S2 task.
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        // Heartbeat.
        s1.fTimer->invoke( timer_task_type::heartbeat_timer );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        std::vector< ptr< srv_config > > configs_out;
        s1.raftServer->get_srv_config_all(configs_out);

        CHK_EQ(expected_cluster_size, configs_out.size());
    }

    {   // Attempt to add S2 again.
        ptr<raft_result> ret =
            s1.raftServer->add_srv( *(s2.getTestMgr()->get_srv_config()) );
        CHK_EQ( cmd_result_code::SERVER_ALREADY_EXISTS, ret->get_result_code() );
    }

    {   // Attempt to add S3 to S2 (non-leader).
        ptr<raft_result> ret =
            s2.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );
        CHK_EQ( cmd_result_code::NOT_LEADER, ret->get_result_code() );
    }

    rpc_handler nl_handler = [&invoked]( ptr<resp_msg>& resp,
                                         ptr<rpc_exception>& err ) -> int {
        invoked.store(true);
        CHK_EQ( cmd_result_code::NOT_LEADER, resp->get_result_code() );
        return 0;
    };
    {   // Attempt to add S3 to S2 (non-leader), through RPC.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        ptr<srv_config> srv = s3.getTestMgr()->get_srv_config();
        ptr<buffer> buf(srv->serialize());
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, buf, log_val_type::cluster_server ) );
        req->log_entries().push_back(log);
        c_net->findClient(s2_addr)->send( req, nl_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Now, normally add S3 to S1.
        s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        // Heartbeat.
        s1.fTimer->invoke( timer_task_type::heartbeat_timer );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        std::vector< ptr< srv_config > > configs_out;
        s1.raftServer->get_srv_config_all(configs_out);

        // All 3 servers should exist.
        CHK_EQ(3, configs_out.size());
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();

    f_base->destroy();

    return 0;
}